

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O0

unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_> __thiscall
IRT::CExpressionList::Copy(CExpressionList *this)

{
  CExpressionList *this_00;
  ulong uVar1;
  size_type sVar2;
  const_reference this_01;
  pointer pCVar3;
  long in_RSI;
  unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_> local_48;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_40;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_38;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> copy;
  int i;
  CExpressionList *newList;
  CExpressionList *this_local;
  
  this_00 = (CExpressionList *)operator_new(0x20);
  CExpressionList(this_00,(CExpression *)0x0);
  copy._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl._0_4_ = 0;
  while( true ) {
    uVar1 = (ulong)(int)copy._M_t.
                        super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                        .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    sVar2 = std::
            vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
            ::size((vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                    *)(in_RSI + 8));
    if (sVar2 <= uVar1) break;
    this_01 = std::
              vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
              ::operator[]((vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                            *)(in_RSI + 8),
                           (long)(int)copy._M_t.
                                      super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                                      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>.
                                      _M_head_impl);
    pCVar3 = std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
             get(this_01);
    (*(pCVar3->super_IExpression).super_INode._vptr_INode[3])();
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_40,&local_38);
    Add(this_00,&local_40);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_40);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_38);
    copy._M_t.
    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t
    .super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl._0_4_ =
         (int)copy._M_t.
              super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
              .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl + 1;
  }
  std::unique_ptr<IRT::CExpressionList_const,std::default_delete<IRT::CExpressionList_const>>::
  unique_ptr<std::default_delete<IRT::CExpressionList_const>,void>
            ((unique_ptr<IRT::CExpressionList_const,std::default_delete<IRT::CExpressionList_const>>
              *)&local_48,this_00);
  std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
  unique_ptr((unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
              *)this,&local_48);
  std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
  ~unique_ptr(&local_48);
  return (__uniq_ptr_data<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const IRT::CExpressionList> IRT::CExpressionList::Copy( ) const {
    CExpressionList *newList = new CExpressionList( );

    for ( int i = 0; i < expressions.size( ); ++i ) {
        std::unique_ptr<const CExpression> copy = expressions[ i ].get( )->Copy( );
        newList->Add( std::move( copy ));
    }
    return std::move( std::unique_ptr<const CExpressionList>( newList ));
}